

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O1

json * __thiscall argo::json::operator[](json *this,string *name)

{
  iterator iVar1;
  pointer __p;
  __uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_> *this_00;
  json_exception *this_01;
  char *json_type_name;
  json *pjVar2;
  
  if (this->m_type != object_e) {
    this_01 = (json_exception *)__cxa_allocate_exception(0xd8);
    json_type_name = get_instance_type_name(this);
    json_exception::json_exception(this_01,not_an_object_e,json_type_name);
    __cxa_throw(this_01,&json_exception::typeinfo,std::exception::~exception);
  }
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>_>
          ::find(&(this->m_value).u_object._M_t,name);
  if (iVar1._M_node == (_Base_ptr)((long)&this->m_value + 8)) {
    __p = (pointer)operator_new(0x58);
    __p->m_type = null_e;
    (__p->m_raw_value)._M_dataplus._M_p = (pointer)&(__p->m_raw_value).field_2;
    (__p->m_raw_value)._M_string_length = 0;
    (__p->m_raw_value).field_2._M_local_buf[0] = '\0';
    this_00 = (__uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_> *)
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>_>
              ::operator[](&(this->m_value).u_object,name);
    std::__uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_>::reset(this_00,__p);
    pjVar2 = (this_00->_M_t).super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>.
             super__Head_base<0UL,_argo::json_*,_false>._M_head_impl;
  }
  else {
    pjVar2 = *(json **)(iVar1._M_node + 2);
  }
  return pjVar2;
}

Assistant:

json &json::operator[](const string &name)
{
    if (m_type == object_e)
    {
        auto i = m_value.u_object.find(name);
        if (i == m_value.u_object.end())
        {
            return *((m_value.u_object)[name] = unique_ptr<json>(new json));
        }
        else
        {
            return *(i->second);
        }
    }
    else
    {
        throw json_exception(json_exception::not_an_object_e, get_instance_type_name());
    }
}